

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

void __thiscall QComboBoxPrivate::updateLineEditGeometry(QComboBoxPrivate *this)

{
  int iVar1;
  QWidget *this_00;
  undefined4 uVar2;
  QRect QVar3;
  undefined4 uVar4;
  char cVar5;
  byte bVar6;
  LayoutDirection direction;
  QStyle *pQVar7;
  QSize QVar8;
  long in_FS_OFFSET;
  QStyleOptionComboBox opt;
  QSize local_100;
  QRect local_f8;
  undefined1 local_e0 [8];
  undefined1 local_d8 [12];
  Representation RStack_cc;
  QStyleOptionComboBox local_c0;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->lineEdit != (QLineEdit *)0x0) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    memset(&local_c0,0xaa,0x90);
    QStyleOptionComboBox::QStyleOptionComboBox(&local_c0);
    (**(code **)(*(long *)this_00 + 0x1b8))(this_00,&local_c0);
    local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffff30 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar7 = QWidget::style(this_00);
    _local_d8 = (QRect)(**(code **)(*(long *)pQVar7 + 0xd8))(pQVar7,1,&local_c0,2,this_00);
    cVar5 = QPersistentModelIndex::isValid();
    if (cVar5 == '\0') {
      bVar6 = 0;
    }
    else {
      QPersistentModelIndex::row();
      QComboBox::itemIcon((QComboBox *)local_e0,(int)this_00);
      bVar6 = QIcon::isNull();
      bVar6 = bVar6 ^ 1;
      QIcon::~QIcon((QIcon *)local_e0);
    }
    QVar3 = _local_d8;
    if (bVar6 != 0) {
      local_f8.x1.m_i = local_d8._0_4_;
      local_f8.y1.m_i = local_d8._4_4_;
      local_f8.x2.m_i = local_d8._8_4_;
      local_f8.y2.m_i = RStack_cc.m_i;
      local_d8._0_4_ = QVar3.x1.m_i;
      uVar2 = local_d8._0_4_;
      local_d8._8_4_ = QVar3.x2.m_i;
      uVar4 = local_d8._8_4_;
      _local_d8 = QVar3;
      QVar8 = QComboBox::iconSize((QComboBox *)this_00);
      iVar1 = local_d8._0_4_ + (uVar4 - (QVar8.wd.m_i.m_i + uVar2));
      local_d8._8_4_ = iVar1 + -4;
      direction = QWidget::layoutDirection(this_00);
      local_100.wd.m_i = (local_d8._8_4_ - local_d8._0_4_) + 1;
      local_100.ht.m_i = (RStack_cc.m_i - local_d8._4_4_) + 1;
      _local_d8 = QStyle::alignedRect(direction,(Alignment)0x2,&local_100,&local_f8);
    }
    QWidget::setGeometry(&this->lineEdit->super_QWidget,(QRect *)local_d8);
    QIcon::~QIcon(&local_c0.currentIcon);
    if (&(local_c0.currentText.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c0.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_c0.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_c0.currentText.d.d)->super_QArrayData,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)&local_c0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBoxPrivate::updateLineEditGeometry()
{
    if (!lineEdit)
        return;

    Q_Q(QComboBox);
    QStyleOptionComboBox opt;
    q->initStyleOption(&opt);
    QRect editRect = q->style()->subControlRect(QStyle::CC_ComboBox, &opt,
                                                QStyle::SC_ComboBoxEditField, q);
    if (currentIndex.isValid() && !q->itemIcon(q->currentIndex()).isNull()) {
        QRect comboRect(editRect);
        editRect.setWidth(editRect.width() - q->iconSize().width() - 4);
        editRect = QStyle::alignedRect(q->layoutDirection(), Qt::AlignRight,
                                       editRect.size(), comboRect);
    }
    lineEdit->setGeometry(editRect);
}